

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  FuncState *pFVar1;
  lua_State *L_00;
  Proto *pPVar2;
  byte bVar3;
  int iVar4;
  Proto **ppPVar5;
  TString *pTVar6;
  long lVar7;
  int iVar8;
  lua_State *L;
  FuncState *fs;
  BlockCnt bl;
  FuncState new_fs;
  BlockCnt local_90;
  FuncState local_78;
  
  pFVar1 = ls->fs;
  L_00 = ls->L;
  pPVar2 = pFVar1->f;
  iVar4 = pPVar2->sizep;
  lVar7 = (long)iVar4;
  if (iVar4 <= pFVar1->np) {
    ppPVar5 = (Proto **)
              luaM_growaux_(L_00,pPVar2->p,pFVar1->np,&pPVar2->sizep,8,0x1ffff,"functions");
    pPVar2->p = ppPVar5;
    iVar8 = pPVar2->sizep;
    if (iVar4 < iVar8) {
      do {
        pPVar2->p[lVar7] = (Proto *)0x0;
        lVar7 = lVar7 + 1;
      } while (iVar8 != lVar7);
    }
  }
  local_78.f = luaF_newproto(L_00);
  ppPVar5 = pPVar2->p;
  iVar4 = pFVar1->np;
  pFVar1->np = iVar4 + 1;
  ppPVar5[iVar4] = local_78.f;
  if (((pPVar2->marked & 0x20) != 0) && (((local_78.f)->marked & 0x18) != 0)) {
    luaC_barrier_(L_00,(GCObject *)pPVar2,(GCObject *)local_78.f);
  }
  (local_78.f)->linedefined = line;
  open_func(ls,&local_78,&local_90);
  checknext(ls,0x28);
  if (ismethod != 0) {
    pTVar6 = luaX_newstring(ls,"self",4);
    new_localvar(ls,pTVar6);
    adjustlocalvars(ls,1);
  }
  pFVar1 = ls->fs;
  pPVar2 = pFVar1->f;
  iVar4 = (ls->t).token;
  iVar8 = 0;
  if (iVar4 == 0x29) {
LAB_0014ae58:
    adjustlocalvars(ls,iVar8);
    bVar3 = pFVar1->nactvar;
    pPVar2->numparams = bVar3;
  }
  else {
    iVar8 = 0;
    while (iVar4 == 0x123) {
      pTVar6 = str_checkname(ls);
      new_localvar(ls,pTVar6);
      if ((ls->t).token != 0x2c) {
        iVar8 = iVar8 + 1;
        goto LAB_0014ae58;
      }
      luaX_next(ls);
      iVar8 = iVar8 + 1;
      iVar4 = (ls->t).token;
    }
    if (iVar4 != 0x118) {
      luaX_syntaxerror(ls,"<name> or \'...\' expected");
    }
    luaX_next(ls);
    adjustlocalvars(ls,iVar8);
    bVar3 = pFVar1->nactvar;
    pPVar2->numparams = bVar3;
    pFVar1->f->is_vararg = '\x01';
    luaK_codeABCk(pFVar1,OP_VARARGPREP,(uint)bVar3,0,0,0);
    bVar3 = pFVar1->nactvar;
  }
  luaK_reserveregs(pFVar1,(uint)bVar3);
  checknext(ls,0x29);
  statlist(ls);
  (local_78.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x105,0x108,line);
  pFVar1 = ls->fs->prev;
  iVar4 = luaK_codeABx(pFVar1,OP_CLOSURE,0,pFVar1->np - 1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOC;
  (e->u).info = iVar4;
  luaK_exp2nextreg(pFVar1,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  '(' parlist ')' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}